

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void kratos::add_generator_static_value(Module *m,string *name,string *value)

{
  Variable local_e0;
  undefined1 local_78 [8];
  Variable v;
  string *value_local;
  string *name_local;
  Module *m_local;
  
  v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = value;
  std::__cxx11::string::string((string *)local_78,(string *)name);
  std::__cxx11::string::string
            ((string *)(v.name.field_2._M_local_buf + 8),
             (string *)
             v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._8_8_);
  v.value.field_2._M_local_buf[8] = '\0';
  std::optional<unsigned_long>::optional((optional<unsigned_long> *)&v.rtl);
  hgdb::json::Variable::Variable(&local_e0,(Variable *)local_78);
  hgdb::json::Module::add_variable(m,&local_e0);
  hgdb::json::Variable::~Variable(&local_e0);
  hgdb::json::Variable::~Variable((Variable *)local_78);
  return;
}

Assistant:

void add_generator_static_value(hgdb::json::Module &m, const std::string &name,
                                const std::string &value) {
    hgdb::json::Variable v{.name = name, .value = value, .rtl = false, .id = std::nullopt};
    m.add_variable(v);
}